

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1f29eed::AverageTest_8x8_quad<unsigned_char>::TestConstantValue
          (AverageTest_8x8_quad<unsigned_char> *this,uchar value)

{
  long lVar1;
  uint y16_idx;
  uint x16_idx;
  bool bVar2;
  
  if (0 < (this->super_AverageTestBase<unsigned_char>).height_ *
          (this->super_AverageTestBase<unsigned_char>).width_) {
    lVar1 = 0;
    do {
      (this->super_AverageTestBase<unsigned_char>).source_data_[lVar1] = value;
      lVar1 = lVar1 + 1;
    } while (lVar1 < (long)(this->super_AverageTestBase<unsigned_char>).height_ *
                     (long)(this->super_AverageTestBase<unsigned_char>).width_);
  }
  x16_idx = 0;
  do {
    y16_idx = 0xfffffffe;
    do {
      y16_idx = y16_idx + 2;
      CheckAveragesAt(this,1,x16_idx,y16_idx);
    } while (y16_idx < 0xe);
    bVar2 = x16_idx < 0xe;
    x16_idx = x16_idx + 2;
  } while (bVar2);
  return;
}

Assistant:

void TestConstantValue(Pixel value) {
    FillConstant(value);
    CheckAverages();
  }